

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::FuncType::~FuncType(FuncType *this)

{
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__FuncType_002e5290;
  FuncSignature::~FuncSignature(&this->sig);
  TypeEntry::~TypeEntry(&this->super_TypeEntry);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Func;
  }